

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStringObject.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptStringObject::DeleteProperty
          (JavascriptStringObject *this,JavascriptString *propertyNameString,
          PropertyOperationFlags propertyOperationFlags)

{
  ScriptContext *scriptContext;
  bool bVar1;
  BOOL BVar2;
  char16 *varName;
  
  bVar1 = BuiltInPropertyRecord<7>::Equals
                    ((BuiltInPropertyRecord<7> *)BuiltInPropertyRecords::length,propertyNameString);
  if (bVar1) {
    scriptContext =
         (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
    varName = JavascriptString::GetString(propertyNameString);
    JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags,scriptContext,varName);
    return 0;
  }
  BVar2 = DynamicObject::DeleteProperty
                    (&this->super_DynamicObject,propertyNameString,propertyOperationFlags);
  return BVar2;
}

Assistant:

BOOL JavascriptStringObject::DeleteProperty(JavascriptString *propertyNameString, PropertyOperationFlags propertyOperationFlags)
    {
        if (BuiltInPropertyRecords::length.Equals(propertyNameString))
        {
            JavascriptError::ThrowCantDeleteIfStrictMode(propertyOperationFlags, this->GetScriptContext(), propertyNameString->GetString());

            return FALSE;
        }
        return DynamicObject::DeleteProperty(propertyNameString, propertyOperationFlags);
    }